

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O0

EVP_MD * cbs_to_md(CBS *cbs)

{
  int iVar1;
  size_t sVar2;
  uint8_t *s1;
  EVP_MD *pEVar3;
  ulong local_20;
  size_t i;
  CBS *cbs_local;
  
  local_20 = 0;
  do {
    if (6 < local_20) {
      return (EVP_MD *)0x0;
    }
    sVar2 = CBS_len(cbs);
    if (sVar2 == kMDOIDs[local_20].oid_len) {
      s1 = CBS_data(cbs);
      iVar1 = OPENSSL_memcmp(s1,kMDOIDs + local_20,(ulong)kMDOIDs[local_20].oid_len);
      if (iVar1 == 0) {
        pEVar3 = EVP_get_digestbynid(kMDOIDs[local_20].nid);
        return pEVar3;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static const EVP_MD *cbs_to_md(const CBS *cbs) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kMDOIDs); i++) {
    if (CBS_len(cbs) == kMDOIDs[i].oid_len &&
        OPENSSL_memcmp(CBS_data(cbs), kMDOIDs[i].oid, kMDOIDs[i].oid_len) ==
            0) {
      return EVP_get_digestbynid(kMDOIDs[i].nid);
    }
  }

  return NULL;
}